

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O3

bech32_error bech32_decode(bech32_DecodedResult *decodedResult,char *str)

{
  pointer puVar1;
  pointer puVar2;
  size_t sVar3;
  ulong uVar4;
  unsigned_long __n2;
  bech32_error bVar5;
  string inputStr;
  undefined1 *local_c0;
  ulong local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  pointer local_a0;
  pointer puStack_98;
  pointer local_90;
  string local_88;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  pointer local_40;
  pointer puStack_38;
  pointer local_30;
  
  bVar5 = E_BECH32_NULL_ARGUMENT;
  if ((((decodedResult != (bech32_DecodedResult *)0x0) && (decodedResult->hrp != (char *)0x0)) &&
      (str != (char *)0x0)) && (decodedResult->dp != (uchar *)0x0)) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    sVar3 = strlen(str);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,str,str + sVar3);
    local_b8 = 0;
    local_b0 = 0;
    local_a0 = (pointer)0x0;
    puStack_98 = (pointer)0x0;
    local_90 = (pointer)0x0;
    local_c0 = &local_b0;
    bech32::decode((DecodedResult *)local_68,&local_88);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_60);
    puVar2 = local_90;
    puVar1 = local_a0;
    local_a0 = local_40;
    puStack_98 = puStack_38;
    local_90 = local_30;
    local_40 = (pointer)0x0;
    puStack_38 = (pointer)0x0;
    local_30 = (pointer)0x0;
    if ((puVar1 != (pointer)0x0) &&
       (operator_delete(puVar1,(long)puVar2 - (long)puVar1), local_40 != (pointer)0x0)) {
      operator_delete(local_40,(long)local_30 - (long)local_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_p != &local_50) {
      operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
    }
    if ((local_b8 == 0) && (local_a0 == puStack_98)) {
      bVar5 = E_BECH32_INVALID_CHECKSUM;
    }
    else {
      bVar5 = E_BECH32_LENGTH_TOO_SHORT;
      if ((local_b8 <= decodedResult->hrplen) &&
         ((ulong)((long)puStack_98 - (long)local_a0) <= decodedResult->dplen)) {
        decodedResult->encoding = local_68._0_4_;
        if (local_b8 == 0) {
          uVar4 = 0;
        }
        else {
          memmove(decodedResult->hrp,local_c0,local_b8);
          uVar4 = local_b8;
        }
        decodedResult->hrp[uVar4] = '\0';
        bVar5 = E_BECH32_SUCCESS;
        if ((long)puStack_98 - (long)local_a0 != 0) {
          memmove(decodedResult->dp,local_a0,(long)puStack_98 - (long)local_a0);
          bVar5 = E_BECH32_SUCCESS;
        }
      }
    }
    if (local_a0 != (pointer)0x0) {
      operator_delete(local_a0,(long)local_90 - (long)local_a0);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar5;
}

Assistant:

bech32_error bech32_decode(bech32_DecodedResult *decodedResult, char const *str) {

    if(decodedResult == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(decodedResult->hrp == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(decodedResult->dp == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(str == nullptr)
        return E_BECH32_NULL_ARGUMENT;

    std::string inputStr(str);

    bech32::DecodedResult localResult;
    try {
        localResult = bech32::decode(inputStr);
    } catch (std::exception &) {
        // todo: convert exception message
        return E_BECH32_UNKNOWN_ERROR;
    }

    if(localResult.hrp.empty() && localResult.dp.empty())
        return E_BECH32_INVALID_CHECKSUM;

    if(localResult.hrp.size() > decodedResult->hrplen)
        return E_BECH32_LENGTH_TOO_SHORT;
    if(localResult.dp.size() > decodedResult->dplen)
        return E_BECH32_LENGTH_TOO_SHORT;

    decodedResult->encoding = static_cast<bech32_encoding>(localResult.encoding);
    std::copy_n(localResult.hrp.begin(), localResult.hrp.size(), decodedResult->hrp);
    decodedResult->hrp[localResult.hrp.size()] = '\0';
    std::copy_n(localResult.dp.begin(), localResult.dp.size(), decodedResult->dp);

    return E_BECH32_SUCCESS;
}